

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O3

bool __thiscall
duckdb::LateMaterialization::TryLateMaterialization
          (LateMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  undefined8 uVar1;
  undefined8 uVar2;
  LogicalOperatorType LVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pCVar5;
  pointer pCVar6;
  pointer puVar7;
  pointer pBVar8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var9;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var10;
  undefined1 auVar11 [8];
  undefined8 uVar12;
  size_t sVar13;
  int iVar14;
  type pLVar15;
  pointer pLVar16;
  reference pvVar17;
  LogicalProjection *pLVar18;
  _Rb_tree_node_base *p_Var19;
  LogicalGet *this_00;
  vector<duckdb::ColumnIndex,_true> *pvVar20;
  iterator iVar21;
  type this_01;
  reference pvVar22;
  pointer pEVar23;
  ulong uVar24;
  LogicalTopN *pLVar25;
  idx_t table_index;
  idx_t iVar26;
  LogicalComparisonJoin *this_02;
  pointer pLVar27;
  LogicalOrder *pLVar28;
  pointer pLVar29;
  type expr_00;
  pointer pLVar30;
  InternalException *this_03;
  bool bVar31;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_1;
  pointer puVar32;
  ulong __n;
  long lVar33;
  pointer pBVar34;
  type pLVar35;
  _Hash_node_base *p_Var36;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_2;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_01;
  long lVar37;
  reference<LogicalOperator> child;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> referenced_columns;
  column_binding_map_t<ReferencedColumn> *__range4;
  vector<duckdb::BoundOrderByNode,_true> final_orders;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  final_proj_list;
  vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> source_operators;
  ColumnBinding rhs_binding;
  ColumnBinding lhs_binding;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_160;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_158;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_150;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_148
  ;
  reference_wrapper<duckdb::LogicalOperator> local_140;
  undefined1 local_138 [8];
  undefined1 auStack_130 [24];
  _Rb_tree_node_base *p_Stack_118;
  pointer local_110;
  pointer local_108;
  __node_base_ptr p_Stack_100;
  undefined1 local_f8 [16];
  bool local_e8;
  _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  __node_base local_b8;
  _Prime_rehash_policy local_a8;
  _Base_ptr local_98;
  vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> local_88;
  undefined1 local_68 [16];
  ExpressionType local_58;
  ColumnBinding local_50;
  ColumnBinding local_40;
  
  local_88.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148 = op;
  pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(op);
  LogicalOperatorVisitor::VisitOperatorExpressions((LogicalOperatorVisitor *)this,pLVar15);
  pLVar16 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(local_148);
  pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&pLVar16->children,0);
  local_140._M_data =
       unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*(pvVar17);
  local_d8 = &(this->super_BaseColumnPruner).column_references._M_h;
  while( true ) {
    while (LVar3 = (local_140._M_data)->type, LVar3 == LOGICAL_PROJECTION) {
      pLVar18 = LogicalOperator::Cast<duckdb::LogicalProjection>(local_140._M_data);
      if (local_88.
          super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::LogicalOperator>const&>
                  ((vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
                    *)&local_88,
                   (iterator)
                   local_88.
                   super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_140);
      }
      else {
        (local_88.
         super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_M_data = local_140._M_data;
        local_88.
        super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      puVar7 = (pLVar18->super_LogicalOperator).expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar32 = (pLVar18->super_LogicalOperator).expressions.
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar7;
          puVar32 = puVar32 + 1) {
        pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar32);
        iVar14 = (*(pEVar23->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar23);
        if ((char)iVar14 != '\0') goto LAB_00d43360;
      }
      auStack_130._0_8_ = auStack_130._0_8_ & 0xffffffff00000000;
      auStack_130._8_8_ = (_Base_ptr)0x0;
      local_110 = (pointer)0x0;
      auStack_130._16_8_ = (_Rb_tree_node_base *)auStack_130;
      p_Stack_118 = (_Rb_tree_node_base *)auStack_130;
      for (p_Var36 = (this->super_BaseColumnPruner).column_references._M_h._M_before_begin._M_nxt;
          p_Var36 != (_Hash_node_base *)0x0; p_Var36 = p_Var36->_M_nxt) {
        if (p_Var36[1]._M_nxt == (_Hash_node_base *)pLVar18->table_index) {
          ::std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)local_138,(unsigned_long *)(p_Var36 + 2));
        }
      }
      ::std::
      _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(local_d8);
      if ((_Rb_tree_node_base *)auStack_130._16_8_ != (_Rb_tree_node_base *)auStack_130) {
        p_Var19 = (_Rb_tree_node_base *)auStack_130._16_8_;
        do {
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          ::operator[](&(pLVar18->super_LogicalOperator).expressions,*(size_type *)(p_Var19 + 1));
          (*(this->super_BaseColumnPruner).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor
            [3])(this);
          p_Var19 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var19);
        } while (p_Var19 != (_Rb_tree_node_base *)auStack_130);
      }
      pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&(local_140._M_data)->children,0);
      local_140._M_data =
           unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar17);
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_138);
    }
    if (LVar3 != LOGICAL_FILTER) break;
    LogicalOperatorVisitor::VisitOperatorExpressions
              ((LogicalOperatorVisitor *)this,local_140._M_data);
    pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&(local_140._M_data)->children,0);
    local_140._M_data =
         unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(pvVar17);
  }
  if (LVar3 == LOGICAL_GET) {
    this_00 = LogicalOperator::Cast<duckdb::LogicalGet>(local_140._M_data);
    uVar24 = (this->super_BaseColumnPruner).column_references._M_h._M_element_count;
    pvVar20 = LogicalGet::GetColumnIds(this_00);
    if ((uVar24 < (ulong)((long)(pvVar20->
                                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ).
                                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar20->
                                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ).
                                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
       ((this_00->function).late_materialization == true)) {
      iVar21 = ::std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this_00->virtual_columns)._M_h,&COLUMN_IDENTIFIER_ROW_ID);
      if (iVar21.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>.
          _M_cur == (__node_type *)0x0) {
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        local_138 = (undefined1  [8])((long)auStack_130 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,
                   "Table function supports late materialization but does not expose a rowid column"
                   ,"");
        InternalException::InternalException(this_03,(string *)local_138);
        __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_d8 = (_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->row_id_type;
      if (local_d8 !=
          (_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)((long)iVar21.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                    ._M_cur + 0x30)) {
        (this->row_id_type).id_ =
             *(LogicalTypeId *)
              ((long)iVar21.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                     ._M_cur + 0x30);
        (this->row_id_type).physical_type_ =
             *(PhysicalType *)
              ((long)iVar21.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                     ._M_cur + 0x31);
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(this->row_id_type).type_info_,
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                   ((long)iVar21.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                          ._M_cur + 0x38));
      }
      ConstructLHS((LateMaterialization *)local_d0,(LogicalGet *)this);
      this_01 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                operator*((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                           *)local_d0);
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01->table_index;
      pvVar20 = LogicalGet::GetColumnIds(this_01);
      pCVar5 = (pvVar20->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_start;
      pCVar6 = (pvVar20->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pLVar35 = this_01;
      local_40.column_index = GetOrInsertRowId(this,this_01);
      local_a8._M_max_load_factor = 0.0;
      local_a8._4_4_ = 0;
      local_a8._M_next_resize = 0;
      local_98 = (_Base_ptr)0x0;
      local_40.table_index = (idx_t)p_Var4;
      if (local_88.
          super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_88.
          super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (pCVar6 != pCVar5) {
          lVar37 = (long)pCVar6 - (long)pCVar5 >> 5;
          lVar33 = 0;
          do {
            GetExpression((LateMaterialization *)local_138,&pLVar35->super_LogicalOperator,
                          (idx_t)this_01);
            pLVar35 = (type)local_138;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_a8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_138);
            if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_138 !=
                (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
              (**(code **)(*(_func_int **)local_138 + 8))();
            }
            lVar33 = lVar33 + 1;
          } while (lVar37 + (ulong)(lVar37 == 0) != lVar33);
        }
      }
      else {
        pvVar22 = vector<std::reference_wrapper<duckdb::LogicalOperator>,_true>::operator[]
                            (&local_88,0);
        puVar32 = (pvVar22->_M_data->expressions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar7 = (pvVar22->_M_data->expressions).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar32 != puVar7) {
          do {
            pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(puVar32);
            (*(pEVar23->super_BaseExpression)._vptr_BaseExpression[0x11])
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_138,pEVar23);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_a8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_138);
            if (local_138 != (undefined1  [8])0x0) {
              (*((BaseExpression *)local_138)->_vptr_BaseExpression[1])();
            }
            puVar32 = puVar32 + 1;
          } while (puVar32 != puVar7);
        }
        if ((long)local_88.
                  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_88.
                  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          uVar24 = (long)local_88.
                         super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                         .
                         super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88.
                         super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                         .
                         super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          __n = 0;
          do {
            __n = __n + 1;
            pLVar35 = this_01;
            if (__n < uVar24) {
              pvVar22 = vector<std::reference_wrapper<duckdb::LogicalOperator>,_true>::operator[]
                                  (&local_88,__n);
              pLVar35 = (type)pvVar22->_M_data;
            }
            sVar13 = local_a8._M_next_resize;
            for (expr_01 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_a8._0_8_;
                expr_01 !=
                (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                sVar13; expr_01 = expr_01 + 1) {
              ReplaceExpressionReferences(this,&pLVar35->super_LogicalOperator,expr_01);
            }
            uVar24 = (long)local_88.
                           super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                           .
                           super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_88.
                           super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                           .
                           super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
          } while (__n < uVar24);
        }
      }
      local_c8 = (undefined1  [16])0x0;
      local_b8._M_nxt = (_Hash_node_base *)0x0;
      pLVar16 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(local_148);
      LVar3 = pLVar16->type;
      if (LVar3 == LOGICAL_TOP_N) {
        pLVar16 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->(local_148);
        pLVar25 = LogicalOperator::Cast<duckdb::LogicalTopN>(pLVar16);
        pBVar34 = (pLVar25->orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar8 = (pLVar25->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar34 != pBVar8) {
          do {
            pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(&pBVar34->expression);
            (*(pEVar23->super_BaseExpression)._vptr_BaseExpression[0x11])
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_138,pEVar23);
            ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
            emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                       local_c8,&pBVar34->type,&pBVar34->null_order,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_138);
            if (local_138 != (undefined1  [8])0x0) {
              (*((BaseExpression *)local_138)->_vptr_BaseExpression[1])();
            }
            pBVar34 = pBVar34 + 1;
          } while (pBVar34 != pBVar8);
        }
      }
      else {
        make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                  ((duckdb *)local_138,(char (*) [6])0x1d8e9c4,(LogicalType *)local_d8,&local_40);
        local_68[0] = 2;
        local_50.table_index._0_1_ = 3;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                  ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                   local_c8,local_68,(OrderByNullType *)&local_50,
                   (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                    *)local_138);
        if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_138 !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (*((BaseExpression *)local_138)->_vptr_BaseExpression[1])();
        }
      }
      local_50 = ConstructRHS(this,local_148);
      table_index = local_50.table_index;
      iVar26 = Binder::GenerateTableIndex(this->optimizer->binder);
      local_50.table_index = iVar26;
      pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*(local_148);
      ReplaceTopLevelTableIndex(this,pLVar15,local_50.table_index);
      this_02 = (LogicalComparisonJoin *)operator_new(0x118);
      LogicalComparisonJoin::LogicalComparisonJoin(this_02,SEMI,LOGICAL_COMPARISON_JOIN);
      local_150._M_head_impl = this_02;
      pLVar27 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_150);
      local_138 = local_d0;
      local_d0 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar27->super_LogicalJoin).super_LogicalOperator.children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_138);
      if (local_138 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_138)->_vptr_BaseExpression[1])();
      }
      pLVar27 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_150);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar27->super_LogicalJoin).super_LogicalOperator.children,local_148);
      local_68 = (undefined1  [16])0x0;
      local_58 = COMPARE_BOUNDARY_START;
      make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                ((duckdb *)local_138,(char (*) [6])0x1d8e9c4,(LogicalType *)local_d8,&local_40);
      auVar11 = local_138;
      local_138 = (undefined1  [8])0x0;
      uVar12 = local_68._0_8_;
      local_68._0_8_ = auVar11;
      if (((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )uVar12 != (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0) &&
         ((**(code **)(*(long *)uVar12 + 8))(), local_138 != (undefined1  [8])0x0)) {
        (*((BaseExpression *)local_138)->_vptr_BaseExpression[1])();
      }
      make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                ((duckdb *)local_138,(char (*) [6])0x1d8e9c4,(LogicalType *)local_d8,&local_50);
      uVar12 = local_68._8_8_;
      local_68._8_8_ = local_138;
      local_138 = (undefined1  [8])0x0;
      if (((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)uVar12
           != (Expression *)0x0) &&
         ((**(code **)(*(long *)uVar12 + 8))(),
         (_Head_base<0UL,_duckdb::Expression_*,_false>)local_138 !=
         (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0)) {
        (*((BaseExpression *)local_138)->_vptr_BaseExpression[1])();
      }
      pLVar27 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_150);
      ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
      emplace_back<duckdb::JoinCondition>
                (&(pLVar27->conditions).
                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                 (JoinCondition *)local_68);
      if (LVar3 == LOGICAL_TOP_N) {
        pLVar28 = (LogicalOrder *)operator_new(0x70);
        local_138 = (undefined1  [8])local_a8._0_8_;
        auStack_130._0_8_ = local_a8._M_next_resize;
        auStack_130._8_8_ = local_98;
        local_a8._M_max_load_factor = 0.0;
        local_a8._4_4_ = 0;
        local_a8._M_next_resize = 0;
        local_98 = (_Base_ptr)0x0;
        LogicalProjection::LogicalProjection
                  ((LogicalProjection *)pLVar28,table_index,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_138);
        local_160._M_head_impl = (LogicalProjection *)pLVar28;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_138);
        pLVar27 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_150);
        if ((pLVar27->super_LogicalJoin).super_LogicalOperator.has_estimated_cardinality == true) {
          pLVar29 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                  *)&local_160);
          pLVar27 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                  *)&local_150);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar29->super_LogicalOperator,
                     (pLVar27->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
        }
        pLVar29 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&local_160);
        local_138 = (undefined1  [8])local_150._M_head_impl;
        local_150._M_head_impl = (LogicalComparisonJoin *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar29->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_138);
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_138 != (Expression *)0x0) {
          (**(code **)(*(long *)local_138 + 8))();
        }
        uVar12 = local_c8._8_8_;
        for (pBVar34 = (pointer)local_c8._0_8_; pBVar34 != (pointer)uVar12; pBVar34 = pBVar34 + 1) {
          expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(&pBVar34->expression);
          ReplaceTableReferences(this,expr_00,table_index);
        }
        pLVar28 = (LogicalOrder *)operator_new(0x98);
        local_138 = (undefined1  [8])local_c8._0_8_;
        auStack_130._0_8_ = local_c8._8_8_;
        auStack_130._8_8_ = local_b8._M_nxt;
        local_c8 = (undefined1  [16])0x0;
        local_b8._M_nxt = (_Hash_node_base *)0x0;
        LogicalOrder::LogicalOrder(pLVar28,(vector<duckdb::BoundOrderByNode,_true> *)local_138);
        local_158._M_head_impl = (LogicalProjection *)pLVar28;
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                  ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                   local_138);
        pLVar29 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&local_160);
        if ((pLVar29->super_LogicalOperator).has_estimated_cardinality == true) {
          pLVar30 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                  *)&local_158);
          pLVar29 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                  *)&local_160);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar30->super_LogicalOperator,
                     (pLVar29->super_LogicalOperator).estimated_cardinality);
        }
        pLVar30 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                *)&local_158);
        local_138 = (undefined1  [8])local_160._M_head_impl;
        local_160._M_head_impl = (LogicalProjection *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar30->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_138);
      }
      else {
        pLVar28 = (LogicalOrder *)operator_new(0x98);
        local_138 = (undefined1  [8])local_c8._0_8_;
        auStack_130._0_8_ = local_c8._8_8_;
        auStack_130._8_8_ = local_b8._M_nxt;
        local_c8 = (undefined1  [16])0x0;
        local_b8._M_nxt = (_Hash_node_base *)0x0;
        LogicalOrder::LogicalOrder(pLVar28,(vector<duckdb::BoundOrderByNode,_true> *)local_138);
        local_160._M_head_impl = (LogicalProjection *)pLVar28;
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                  ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                   local_138);
        pLVar27 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&local_150);
        if ((pLVar27->super_LogicalJoin).super_LogicalOperator.has_estimated_cardinality == true) {
          pLVar30 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                  *)&local_160);
          pLVar27 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                  *)&local_150);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar30->super_LogicalOperator,
                     (pLVar27->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
        }
        pLVar30 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                *)&local_160);
        local_138 = (undefined1  [8])local_150._M_head_impl;
        local_150._M_head_impl = (LogicalComparisonJoin *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar30->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_138);
        if (local_138 != (undefined1  [8])0x0) {
          (*(((LogicalJoin *)local_138)->super_LogicalOperator)._vptr_LogicalOperator[1])();
        }
        pLVar28 = (LogicalOrder *)operator_new(0x70);
        local_138 = (undefined1  [8])local_a8._0_8_;
        auStack_130._0_8_ = local_a8._M_next_resize;
        auStack_130._8_8_ = local_98;
        local_a8._M_max_load_factor = 0.0;
        local_a8._4_4_ = 0;
        local_a8._M_next_resize = 0;
        local_98 = (_Base_ptr)0x0;
        LogicalProjection::LogicalProjection
                  ((LogicalProjection *)pLVar28,table_index,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_138);
        local_158._M_head_impl = (LogicalProjection *)pLVar28;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_138);
        pLVar30 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                *)&local_160);
        if ((pLVar30->super_LogicalOperator).has_estimated_cardinality == true) {
          pLVar29 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                  *)&local_158);
          pLVar30 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                  *)&local_160);
          LogicalOperator::SetEstimatedCardinality
                    (&pLVar29->super_LogicalOperator,
                     (pLVar30->super_LogicalOperator).estimated_cardinality);
        }
        pLVar29 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)&local_158);
        local_138 = (undefined1  [8])local_160._M_head_impl;
        local_160._M_head_impl = (LogicalProjection *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                    *)&(pLVar29->super_LogicalOperator).children,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_138);
      }
      if (local_138 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_138 + 8))();
      }
      _Var10._M_head_impl = local_158._M_head_impl;
      local_158._M_head_impl = (LogicalProjection *)0x0;
      _Var9._M_head_impl =
           (local_148->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_148->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           &(_Var10._M_head_impl)->super_LogicalOperator;
      if ((_Var9._M_head_impl != (LogicalOperator *)0x0) &&
         ((**(code **)((long)(_Var9._M_head_impl)->_vptr_LogicalOperator + 8))(),
         local_158._M_head_impl != (LogicalProjection *)0x0)) {
        (*((local_158._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      if (local_160._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_160._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      auStack_130._0_8_ = &p_Stack_100;
      auStack_130._8_8_ = &DAT_00000001;
      uVar1 = this->optimizer->context;
      uVar2 = this->optimizer->binder;
      auStack_130._16_8_ = (_Rb_tree_node_base *)0x0;
      p_Stack_118 = (_Rb_tree_node_base *)0x0;
      local_110 = (pointer)CONCAT44(local_110._4_4_,0x3f800000);
      local_108 = (pointer)0x0;
      p_Stack_100 = (__node_base_ptr)0x0;
      local_138 = (undefined1  [8])&PTR__BaseColumnPruner_02434ac8;
      local_f8._8_4_ = (int)uVar1;
      local_f8._0_8_ = uVar2;
      local_f8._12_4_ = (int)((ulong)uVar1 >> 0x20);
      local_e8 = true;
      pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*(local_148);
      RemoveUnusedColumns::VisitOperator((RemoveUnusedColumns *)local_138,pLVar15);
      local_138 = (undefined1  [8])&PTR__BaseColumnPruner_024349f8;
      ::std::
      _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)auStack_130);
      if ((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          local_68._8_8_ !=
          (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0) {
        (**(code **)(*(long *)local_68._8_8_ + 8))();
      }
      local_68._8_8_ = 0;
      if ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
          local_68._0_8_ !=
          (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 8))();
      }
      if (local_150._M_head_impl != (LogicalComparisonJoin *)0x0) {
        (*((local_150._M_head_impl)->super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator
          [1])();
      }
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                 local_c8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_a8);
      if (local_d0 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_d0 + 8))();
      }
      bVar31 = true;
      goto LAB_00d43362;
    }
  }
LAB_00d43360:
  bVar31 = false;
LAB_00d43362:
  if (local_88.
      super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar31;
}

Assistant:

bool LateMaterialization::TryLateMaterialization(unique_ptr<LogicalOperator> &op) {
	// check if we can benefit from late materialization
	// we need to see how many columns we require in the pipeline versus how many columns we emit in the scan
	// for example, in a query like SELECT * FROM tbl ORDER BY ts LIMIT 5, the top-n only needs the "ts" column
	// the other columns can be fetched later on using late materialization
	// we can only push late materialization through a subset of operators
	// and we can only do it for scans that support the row-id pushdown (currently only DuckDB table scans)

	// visit the expressions for each operator in the chain
	vector<reference<LogicalOperator>> source_operators;

	VisitOperatorExpressions(*op);
	reference<LogicalOperator> child = *op->children[0];
	while (child.get().type != LogicalOperatorType::LOGICAL_GET) {
		switch (child.get().type) {
		case LogicalOperatorType::LOGICAL_PROJECTION: {
			// recurse into the child node - but ONLY visit expressions that are referenced
			auto &proj = child.get().Cast<LogicalProjection>();
			source_operators.push_back(child);

			for (auto &expr : proj.expressions) {
				if (expr->IsVolatile()) {
					// we cannot do this optimization if any of the columns are volatile
					return false;
				}
			}

			// figure out which projection expressions we are currently referencing
			set<idx_t> referenced_columns;
			for (auto &entry : column_references) {
				auto &column_binding = entry.first;
				if (column_binding.table_index == proj.table_index) {
					referenced_columns.insert(column_binding.column_index);
				}
			}
			// clear the list of referenced expressions and visit those columns
			column_references.clear();
			for (auto &col_idx : referenced_columns) {
				VisitExpression(&proj.expressions[col_idx]);
			}
			// continue into child
			child = *child.get().children[0];
			break;
		}
		case LogicalOperatorType::LOGICAL_FILTER: {
			// visit filter expressions - we need these columns
			VisitOperatorExpressions(child.get());
			// continue into child
			child = *child.get().children[0];
			break;
		}
		default:
			// unsupported operator for late materialization
			return false;
		}
	}
	auto &get = child.get().Cast<LogicalGet>();
	if (column_references.size() >= get.GetColumnIds().size()) {
		// we do not benefit from late materialization
		// we need all of the columns to compute the root node anyway (Top-N/Limit/etc)
		return false;
	}
	if (!get.function.late_materialization) {
		// this function does not support late materialization
		return false;
	}
	auto entry = get.virtual_columns.find(COLUMN_IDENTIFIER_ROW_ID);
	if (entry == get.virtual_columns.end()) {
		throw InternalException("Table function supports late materialization but does not expose a rowid column");
	}
	row_id_type = entry->second.type;
	// we benefit from late materialization
	// we need to transform this plan into a semi-join with the row-id
	// we need to ensure the operator returns exactly the same column bindings as before

	// construct the LHS from the LogicalGet
	auto lhs = ConstructLHS(get);
	// insert the row-id column on the left hand side
	auto &lhs_get = *lhs;
	auto lhs_index = lhs_get.table_index;
	auto lhs_columns = lhs_get.GetColumnIds().size();
	auto lhs_row_idx = GetOrInsertRowId(lhs_get);
	ColumnBinding lhs_binding(lhs_index, lhs_row_idx);

	// after constructing the LHS but before constructing the RHS we construct the final projections/orders
	// - we do this before constructing the RHS because that alter the original plan
	vector<unique_ptr<Expression>> final_proj_list;
	// construct the final projection list from either (1) the root projection, or (2) the logical get
	if (!source_operators.empty()) {
		// construct the columns from the root projection
		auto &root_proj = source_operators[0].get();
		for (auto &expr : root_proj.expressions) {
			final_proj_list.push_back(expr->Copy());
		}
		// now we need to "flatten" the projection list by traversing the set of projections and inlining them
		for (idx_t i = 0; i < source_operators.size(); i++) {
			auto &next_operator = i + 1 < source_operators.size() ? source_operators[i + 1].get() : lhs_get;
			for (auto &expr : final_proj_list) {
				ReplaceExpressionReferences(next_operator, expr);
			}
		}
	} else {
		// if we have no projection directly construct the columns from the root get
		for (idx_t i = 0; i < lhs_columns; i++) {
			final_proj_list.push_back(GetExpression(lhs_get, i));
		}
	}

	// we need to re-order again at the end
	vector<BoundOrderByNode> final_orders;
	auto root_type = op->type;
	if (root_type == LogicalOperatorType::LOGICAL_TOP_N) {
		// for top-n we need to re-order by the top-n conditions
		auto &top_n = op->Cast<LogicalTopN>();
		for (auto &order : top_n.orders) {
			auto expr = order.expression->Copy();
			final_orders.emplace_back(order.type, order.null_order, std::move(expr));
		}
	} else {
		// for limit/sample we order by row-id
		auto row_id_expr = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, lhs_binding);
		final_orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(row_id_expr));
	}

	// construct the RHS for the join
	// this is essentially the old pipeline, but with the `rowid` column added
	// note that the purpose of this optimization is to remove columns from the RHS
	// we don't do that here yet though - we do this in a later step using the RemoveUnusedColumns optimizer
	auto rhs_binding = ConstructRHS(op);

	// the final table index emitted must be the table index of the original operator
	// this ensures any upstream operators that refer to the original get will keep on referring to the correct columns
	auto final_index = rhs_binding.table_index;

	// we need to replace any references to "rhs_binding.table_index" in the rhs to a new table index
	rhs_binding.table_index = optimizer.binder.GenerateTableIndex();
	ReplaceTopLevelTableIndex(*op, rhs_binding.table_index);

	// construct a semi join between the lhs and rhs
	auto join = make_uniq<LogicalComparisonJoin>(JoinType::SEMI);
	join->children.push_back(std::move(lhs));
	join->children.push_back(std::move(op));
	JoinCondition condition;
	condition.comparison = ExpressionType::COMPARE_EQUAL;
	condition.left = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, lhs_binding);
	condition.right = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, rhs_binding);
	join->conditions.push_back(std::move(condition));

	// push a projection that removes the row id again from the lhs
	// this is the final projection - so it should have the final table index
	auto proj_index = final_index;
	if (root_type == LogicalOperatorType::LOGICAL_TOP_N) {
		// for top-n we need to order on expressions, so we need to order AFTER the final projection
		auto proj = make_uniq<LogicalProjection>(proj_index, std::move(final_proj_list));
		if (join->has_estimated_cardinality) {
			proj->SetEstimatedCardinality(join->estimated_cardinality);
		}
		proj->children.push_back(std::move(join));

		for (auto &order : final_orders) {
			ReplaceTableReferences(*order.expression, proj_index);
		}
		auto order = make_uniq<LogicalOrder>(std::move(final_orders));
		if (proj->has_estimated_cardinality) {
			order->SetEstimatedCardinality(proj->estimated_cardinality);
		}
		order->children.push_back(std::move(proj));

		op = std::move(order);
	} else {
		// for limit/sample we order on row-id, so we need to order BEFORE the final projection
		// because the final projection removes row-ids
		auto order = make_uniq<LogicalOrder>(std::move(final_orders));
		if (join->has_estimated_cardinality) {
			order->SetEstimatedCardinality(join->estimated_cardinality);
		}
		order->children.push_back(std::move(join));

		auto proj = make_uniq<LogicalProjection>(proj_index, std::move(final_proj_list));
		if (order->has_estimated_cardinality) {
			proj->SetEstimatedCardinality(order->estimated_cardinality);
		}
		proj->children.push_back(std::move(order));

		op = std::move(proj);
	}

	// run the RemoveUnusedColumns optimizer to prune the (now) unused columns the plan
	RemoveUnusedColumns unused_optimizer(optimizer.binder, optimizer.context, true);
	unused_optimizer.VisitOperator(*op);
	return true;
}